

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

int __thiscall ncnn::Net::custom_layer_to_index(Net *this,char *type)

{
  int iVar1;
  size_type sVar2;
  reference pvVar3;
  char *in_RSI;
  long in_RDI;
  size_t i;
  size_t custom_layer_registry_entry_count;
  size_type local_28;
  
  sVar2 = std::
          vector<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
          ::size((vector<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
                  *)(*(long *)(in_RDI + 0x48) + 0x98));
  local_28 = 0;
  while( true ) {
    if (sVar2 <= local_28) {
      return -1;
    }
    pvVar3 = std::
             vector<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
             ::operator[]((vector<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
                           *)(*(long *)(in_RDI + 0x48) + 0x98),local_28);
    iVar1 = strcmp(in_RSI,pvVar3->name);
    if (iVar1 == 0) break;
    local_28 = local_28 + 1;
  }
  return (int)local_28;
}

Assistant:

int Net::custom_layer_to_index(const char* type)
{
    const size_t custom_layer_registry_entry_count = d->custom_layer_registry.size();
    for (size_t i = 0; i < custom_layer_registry_entry_count; i++)
    {
        if (strcmp(type, d->custom_layer_registry[i].name) == 0)
            return static_cast<int>(i);
    }

    return -1;
}